

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

size_t * __thiscall
andres::
BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
::shapeEnd(BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
           *this)

{
  View<float,_true,_std::allocator<unsigned_long>_> *this_00;
  runtime_error *this_01;
  View<float,_true,_std::allocator<unsigned_long>_> *this_02;
  
  this_02 = this->e1_;
  if (this_02->data_ == (pointer)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
  }
  else {
    this_00 = this->e2_;
    if (this_00->data_ == (pointer)0x0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
    }
    else if ((this_02->geometry_).dimension_ < (this_00->geometry_).dimension_) {
      View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
      this_02 = this_00;
      if (this_00->data_ != (pointer)0x0) {
LAB_00205ef2:
        return (this_02->geometry_).shape_ + (this_02->geometry_).dimension_;
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
    }
    else {
      View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_02);
      if (this_02->data_ != (pointer)0x0) goto LAB_00205ef2;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
    }
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::size_t* shapeEnd() const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shapeEnd() : e1_.shapeEnd(); }